

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

Vec_Int_t * Vec_IntAlloc(int nCap)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  int iVar3;
  
  pVVar1 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < nCap - 1U) {
    iVar3 = nCap;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar3;
  if (iVar3 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar3 << 2);
  }
  pVVar1->pArray = piVar2;
  return pVVar1;
}

Assistant:

static inline Vec_Int_t * Vec_IntAlloc( int nCap )
{
    Vec_Int_t * p;
    p = ABC_ALLOC( Vec_Int_t, 1 );
    if ( nCap > 0 && nCap < 16 )
        nCap = 16;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_ALLOC( int, p->nCap ) : NULL;
    return p;
}